

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryTestCase.cpp
# Opt level: O3

void __thiscall SuiteDataDictionaryTests::TestaddMsgField::~TestaddMsgField(TestaddMsgField *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(addMsgField)
{
  DataDictionary object;
  CHECK( !object.isMsgField( "A", 10 ) );
  CHECK( !object.isMsgField( "Z", 50 ) );
  object.addMsgField( "A", 10 );
  object.addMsgField( "Z", 50 );
  CHECK( object.isMsgField( "A", 10 ) );
  CHECK( object.isMsgField( "Z", 50 ) );
  CHECK( !object.isMsgField( "A", 50 ) );
  CHECK( !object.isMsgField( "Z", 10 ) );
}